

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTC6845.hpp
# Opt level: O1

void __thiscall
Motorola::CRTC::
CRTC6845<PCCompatible::CGA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
::do_end_of_line(CRTC6845<PCCompatible::CGA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
                 *this)

{
  int *piVar1;
  ushort uVar2;
  uint16_t uVar3;
  bool bVar4;
  uint8_t uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar2 = (this->bus_state_).row_address;
  bVar4 = (bool)(uVar2 != (this->layout_).vertical.end_cursor & this->is_cursor_line_);
  this->is_cursor_line_ = bVar4;
  if ((this->bus_state_).vsync == true) {
    uVar7 = this->vsync_counter_ + 1U & 0xf;
    this->vsync_counter_ = uVar7;
    (this->bus_state_).vsync = uVar7 != (this->layout_).vertical.sync_lines;
  }
  if (this->is_in_adjustment_period_ == true) {
    uVar5 = this->line_counter_ + '\x01';
    this->line_counter_ = uVar5;
    if (uVar5 == (this->layout_).vertical.adjust) {
      this->is_in_adjustment_period_ = false;
      this->line_counter_ = '\0';
LAB_00393562:
      this->line_is_visible_ = true;
      uVar3 = (this->layout_).start_address;
      this->line_address_ = uVar3;
      (this->bus_state_).refresh_address = uVar3;
      piVar1 = &(this->bus_state_).field_count;
      *piVar1 = *piVar1 + 1;
    }
  }
  else if (uVar2 == (this->layout_).vertical.end_row) {
    (this->bus_state_).row_address = 0;
    this->line_address_ = this->end_of_line_address_;
    if (this->line_counter_ == (this->layout_).vertical.total) {
      uVar5 = (this->layout_).vertical.adjust;
      this->line_counter_ = '\0';
      if (uVar5 == '\0') goto LAB_00393562;
      this->is_in_adjustment_period_ = true;
    }
    else {
      bVar6 = this->line_counter_ + 1 & 0x7f;
      this->line_counter_ = bVar6;
      if (bVar6 == (this->layout_).vertical.start_sync) {
        (this->bus_state_).vsync = true;
        this->vsync_counter_ = 0;
      }
      if (bVar6 == (this->layout_).vertical.displayed) {
        this->line_is_visible_ = false;
      }
    }
  }
  else {
    (this->bus_state_).row_address = uVar2 + 1 & 0x1f;
  }
  uVar2 = (this->bus_state_).row_address;
  (this->bus_state_).refresh_address = this->line_address_;
  this->character_counter_ = '\0';
  this->character_is_visible_ = (this->layout_).horizontal.displayed != '\0';
  bVar4 = (bool)(bVar4 | uVar2 == (this->layout_).vertical.start_cursor);
  this->is_cursor_line_ = bVar4;
  switch((this->layout_).cursor_flags) {
  case '\0':
    bVar6 = (byte)(this->bus_state_).field_count;
    goto LAB_003935fe;
  case '\x01':
    bVar4 = false;
    break;
  case '\x02':
    bVar4 = true;
    break;
  case '\x03':
    bVar6 = ~(byte)(this->bus_state_).field_count;
LAB_003935fe:
    bVar4 = (bool)(bVar6 >> 3 & bVar4);
    break;
  default:
    goto switchD_003935ee_default;
  }
  this->is_cursor_line_ = bVar4;
switchD_003935ee_default:
  return;
}

Assistant:

inline void do_end_of_line() {
			if constexpr (cursor_type != CursorType::None) {
				// Check for cursor disable.
				// TODO: this is handled differently on the EGA, should I ever implement that.
				is_cursor_line_ &= bus_state_.row_address != layout_.vertical.end_cursor;
			}

			// Check for end of vertical sync.
			if(bus_state_.vsync) {
				vsync_counter_ = (vsync_counter_ + 1) & 15;
				// On the UM6845R and AMS40226, honour the programmed vertical sync time; on the other CRTCs
				// always use a vertical sync count of 16.
				switch(personality) {
					case Personality::HD6845S:
					case Personality::AMS40226:
						bus_state_.vsync = vsync_counter_ != layout_.vertical.sync_lines;
					break;
					default:
						bus_state_.vsync = vsync_counter_ != 0;
					break;
				}
			}

			if(is_in_adjustment_period_) {
				line_counter_++;
				if(line_counter_ == layout_.vertical.adjust) {
					is_in_adjustment_period_ = false;
					do_end_of_frame();
				}
			} else {
				// Advance vertical counter.
				if(bus_state_.row_address == layout_.vertical.end_row) {
					bus_state_.row_address = 0;
					line_address_ = end_of_line_address_;

					// Check for entry into the overflow area.
					if(line_counter_ == layout_.vertical.total) {
						if(layout_.vertical.adjust) {
							line_counter_ = 0;
							is_in_adjustment_period_ = true;
						} else {
							do_end_of_frame();
						}
					} else {
						line_counter_ = (line_counter_ + 1) & 0x7f;

						// Check for start of vertical sync.
						if(line_counter_ == layout_.vertical.start_sync) {
							bus_state_.vsync = true;
							vsync_counter_ = 0;
						}

						// Check for end of visible lines.
						if(line_counter_ == layout_.vertical.displayed) {
							line_is_visible_ = false;
						}
					}
				} else {
					bus_state_.row_address = (bus_state_.row_address + 1) & 0x1f;
				}
			}

			bus_state_.refresh_address = line_address_;
			character_counter_ = 0;
			character_is_visible_ = (layout_.horizontal.displayed != 0);

			if constexpr (cursor_type != CursorType::None) {
				// Check for cursor enable.
				is_cursor_line_ |= bus_state_.row_address == layout_.vertical.start_cursor;

				switch(cursor_type) {
					// MDA-style blinking.
					// https://retrocomputing.stackexchange.com/questions/27803/what-are-the-blinking-rates-of-the-caret-and-of-blinking-text-on-pc-graphics-car
					// gives an 8/8 pattern for regular blinking though mode 11 is then just a guess.
					case CursorType::MDA:
						switch(layout_.cursor_flags) {
							case 0b11: is_cursor_line_ &= (bus_state_.field_count & 8) < 3;	break;
							case 0b00: is_cursor_line_ &= bool(bus_state_.field_count & 8);	break;
							case 0b01: is_cursor_line_ = false;								break;
							case 0b10: is_cursor_line_ = true;								break;
							default: break;
						}
					break;
				}
			}
		}